

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O2

void from_json(json *j,PatternAddressMapper *p)

{
  _Alloc_hider __p;
  const_reference pvVar1;
  key_type local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"id",&local_21);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(j,&local_48);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar1,&p->instance_id);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"aggressor_to_addr",&local_21);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(j,&local_48);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int,DRAMAddr,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,DRAMAddr>>,void>
            (pvVar1,&p->aggressor_to_addr);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"bit_flips",&local_21);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(j,&local_48);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>,_0>
            (pvVar1,&p->bit_flips);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"min_row",&local_21);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(j,&local_48);
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
            (pvVar1,&p->min_row);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"max_row",&local_21);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(j,&local_48);
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
            (pvVar1,&p->max_row);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"bank_no",&local_21);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(j,&local_48);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
            (pvVar1,&p->bank_no);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"reproducibility_score",&local_21);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(j,&local_48);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
            (pvVar1,&p->reproducibility_score);
  std::__cxx11::string::~string((string *)&local_48);
  std::make_unique<CodeJitter>();
  __p._M_p = local_48._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>::reset
            ((__uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_> *)&p->code_jitter,
             (pointer)__p._M_p);
  std::unique_ptr<CodeJitter,_std::default_delete<CodeJitter>_>::~unique_ptr
            ((unique_ptr<CodeJitter,_std::default_delete<CodeJitter>_> *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"code_jitter",&local_21);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(j,&local_48);
  from_json(pvVar1,(p->code_jitter)._M_t.
                   super___uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>._M_t.
                   super__Tuple_impl<0UL,_CodeJitter_*,_std::default_delete<CodeJitter>_>.
                   super__Head_base<0UL,_CodeJitter_*,_false>._M_head_impl);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void from_json(const nlohmann::json &j, PatternAddressMapper &p) {
  j.at("id").get_to(p.get_instance_id());
  j.at("aggressor_to_addr").get_to(p.aggressor_to_addr);
  j.at("bit_flips").get_to(p.bit_flips);
  j.at("min_row").get_to(p.min_row);
  j.at("max_row").get_to(p.max_row);
  j.at("bank_no").get_to(p.bank_no);
  j.at("reproducibility_score").get_to(p.reproducibility_score);
  p.code_jitter = std::make_unique<CodeJitter>();
  j.at("code_jitter").get_to(*p.code_jitter);
}